

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

int Acb_NtkIsPiBuffers(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  if (0 < iObj) {
    do {
      if ((p->vObjType).nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p->vObjType).pArray[(uint)iObj] == '\x03') {
        return 1;
      }
      if ((p->vObjFans).nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = (p->vObjFans).pArray[(uint)iObj];
      lVar3 = (long)iVar1;
      if ((lVar3 < 0) || ((p->vFanSto).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar2 = (p->vFanSto).pArray;
      if (piVar2[lVar3] != 1) {
        return 0;
      }
      iObj = piVar2[lVar3 + 1];
    } while (0 < iObj);
  }
  __assert_fail("i>0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_NtkIsPiBuffers( Acb_Ntk_t * p, int iObj )
{
    if ( Acb_ObjIsCi(p, iObj) )
        return 1;
    if ( Acb_ObjFaninNum(p, iObj) != 1 )
        return 0;
    return Acb_NtkIsPiBuffers( p, Acb_ObjFanin(p, iObj, 0) );
}